

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream-reader.hh
# Opt level: O0

bool __thiscall tinyusdz::StreamReader::read4(StreamReader *this,uint32_t *ret)

{
  uint32_t local_24;
  uint32_t *puStack_20;
  uint32_t val;
  uint32_t *ret_local;
  StreamReader *this_local;
  
  if (this->length_ < this->idx_ + 4) {
    this_local._7_1_ = false;
  }
  else {
    local_24 = *(uint32_t *)(this->binary_ + this->idx_);
    puStack_20 = ret;
    if ((this->swap_endian_ & 1U) != 0) {
      ret_local = (uint32_t *)this;
      anon_unknown_28::swap4(&local_24);
    }
    *puStack_20 = local_24;
    this->idx_ = this->idx_ + 4;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool read4(uint32_t *ret) const {
    if ((idx_ + 4) > length_) {
      return false;
    }

    uint32_t val;
    memcpy(&val, &binary_[idx_], sizeof(val));

    if (swap_endian_) {
      swap4(&val);
    }

    (*ret) = val;
    idx_ += 4;

    return true;
  }